

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baling.h
# Opt level: O3

void __thiscall Baling::Baling(Baling *this)

{
  Polygon::Polygon(&this->super_Polygon);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  Polygon::addPoint((Point *)this);
  return;
}

Assistant:

Baling() {
    addPoint(Point<double>(400,350));
    addPoint(Point<double>(634,493));
    addPoint(Point<double>(664,406));
    addPoint(Point<double>(444,275));
    addPoint(Point<double>(450,0));
    addPoint(Point<double>(350,0));
    addPoint(Point<double>(356,275));
    addPoint(Point<double>(115,406));
    addPoint(Point<double>(150,493));
  }